

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_zero_diagonal(Integer g_a)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  char *ptr;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer andim;
  Integer atype;
  Integer adims [2];
  _iterator_hdl hdl;
  char *local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  Integer local_358;
  Integer local_350;
  Integer local_348 [3];
  _iterator_hdl local_330;
  long lVar4;
  
  pnga_nodeid();
  iVar1 = _ga_sync_end;
  bVar7 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar7) {
    pnga_sync();
  }
  pnga_inquire(g_a,&local_350,&local_358,local_348);
  pnga_local_iterator_init(g_a,&local_330);
  iVar2 = pnga_local_iterator_next(&local_330,&local_368,&local_378,&local_388,&local_380);
  if (iVar2 != 0) {
    do {
      if (0 < local_368) {
        lVar5 = local_360;
        if (local_360 < local_368) {
          lVar5 = local_368;
        }
        lVar4 = local_370;
        if (local_378 < local_370) {
          lVar4 = local_378;
        }
        lVar3 = lVar4 - lVar5;
        if (lVar5 <= lVar4) {
          switch(local_350) {
          case 0x3e9:
            lVar3 = lVar3 + 1;
            pcVar6 = local_388;
            do {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6 = pcVar6 + local_380 * 4 + 4;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
            break;
          case 0x3ea:
            if (lVar3 < 1) {
              lVar3 = 0;
            }
            lVar3 = lVar3 + 1;
            pcVar6 = local_388;
            do {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6[4] = '\0';
              pcVar6[5] = '\0';
              pcVar6[6] = '\0';
              pcVar6[7] = '\0';
              pcVar6 = pcVar6 + local_380 * 8 + 8;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
            break;
          case 0x3eb:
            lVar3 = lVar3 + 1;
            pcVar6 = local_388;
            do {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6 = pcVar6 + local_380 * 4 + 4;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
            break;
          case 0x3ec:
            lVar3 = lVar3 + 1;
            pcVar6 = local_388;
            do {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6[4] = '\0';
              pcVar6[5] = '\0';
              pcVar6[6] = '\0';
              pcVar6[7] = '\0';
              pcVar6 = pcVar6 + local_380 * 8 + 8;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
            break;
          default:
            pnga_error("set_diagonal_zero: wrong data type:",local_350);
            break;
          case 0x3ee:
            lVar3 = lVar3 + 1;
            pcVar6 = local_388;
            do {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6[4] = '\0';
              pcVar6[5] = '\0';
              pcVar6[6] = '\0';
              pcVar6[7] = '\0';
              pcVar6 = pcVar6 + local_380 * 8 + 8;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
            break;
          case 0x3ef:
            lVar3 = lVar3 + 1;
            pcVar6 = local_388;
            do {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6[4] = '\0';
              pcVar6[5] = '\0';
              pcVar6[6] = '\0';
              pcVar6[7] = '\0';
              pcVar6[8] = '\0';
              pcVar6[9] = '\0';
              pcVar6[10] = '\0';
              pcVar6[0xb] = '\0';
              pcVar6[0xc] = '\0';
              pcVar6[0xd] = '\0';
              pcVar6[0xe] = '\0';
              pcVar6[0xf] = '\0';
              pcVar6 = pcVar6 + local_380 * 0x10 + 0x10;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
        }
      }
      iVar2 = pnga_local_iterator_next(&local_330,&local_368,&local_378,&local_388,&local_380);
    } while (iVar2 != 0);
  }
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_zero_diagonal(Integer g_a)
{
  Integer /*dim1, dim2,*/ type;
  Integer ld, lo[2], hi[2], loA[2], hiA[2];
  Integer me = pnga_nodeid (), i, offset;
  char *ptr;
  Integer num_blocks_a;
  Integer atype, andim, adims[2];
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire (g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  /*dim2 = adims[1];*/
  type = atype;

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    offset = 0;
    if (loA[0] > 0) {
      lo[0] = GA_MAX (loA[0], loA[1]);
      lo[1] = GA_MAX (loA[0], loA[1]);
      hi[0] = GA_MIN (hiA[0], hiA[1]);
      hi[1] = GA_MIN (hiA[0], hiA[1]);
      if (hi[0] >= lo[0]) {
        sgai_zero_diagonal_block(g_a, ptr, lo, hi, ld, offset, type);
      }
    }
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    offset = 0;
    pnga_distribution (g_a, me, loA, hiA);
    /* determine subset of my patch to access */
    if (loA[0] > 0) {
      lo[0] = GA_MAX (loA[0], loA[1]);
      lo[1] = GA_MAX (loA[0], loA[1]);
      hi[0] = GA_MIN (hiA[0], hiA[1]);
      hi[1] = GA_MIN (hiA[0], hiA[1]);
      if (hi[0] >= lo[0]) {
                              /* we got a block containing diagonal elements */
        pnga_access_ptr (g_a, lo, hi, &ptr, &ld);
        sgai_zero_diagonal_block(g_a, ptr, lo, hi, ld, offset, type);
        /* release access to the data */
        pnga_release_update (g_a, lo, hi);
      }
    }
  } else {
    Integer idx, lld[MAXDIM], offset;
    Integer jtot, last, j;
    Integer nproc = pnga_nnodes();
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        lo[0] = GA_MAX (loA[0], loA[1]);
        lo[1] = GA_MAX (loA[0], loA[1]);
        hi[0] = GA_MIN (hiA[0], hiA[1]);
        hi[1] = GA_MIN (hiA[0], hiA[1]);

        if (hi[0] >= lo[0]) {
          pnga_access_block_ptr(g_a, idx, &ptr, lld);
          /* evaluate offsets for system */
          offset = 0;
          last = andim - 1;
          jtot = 1;
          for (j=0; j<last; j++) {
            offset += (lo[j] - loA[j])*jtot;
            jtot *= lld[j];
          }
          offset += (lo[last]-loA[last])*jtot;
          sgai_zero_diagonal_block(g_a, ptr, lo, hi, lld[0], offset, type);
          pnga_release_update_block(g_a, idx);
        }
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer lld[MAXDIM]/*, chk*/;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);

      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        /*chk = 1;*/
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          /*if (hiA[i] < loA[i]) chk = 0;*/
        }
        lo[0] = GA_MAX (loA[0], loA[1]);
        lo[1] = GA_MAX (loA[0], loA[1]);
        hi[0] = GA_MIN (hiA[0], hiA[1]);
        hi[1] = GA_MIN (hiA[0], hiA[1]);

        if (hi[0] >= lo[0]) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, lld);
          /* evaluate offsets for system */
          offset = 0;
          last = andim - 1;
          jtot = 1;
          for (j=0; j<last; j++) {
            offset += (lo[j] - loA[j])*jtot;
            jtot *= lld[j];
          }
          offset += (lo[last]-loA[last])*jtot;
          sgai_zero_diagonal_block(g_a, ptr, lo, hi, lld[0], offset, type);
          pnga_release_update_block_grid(g_a, index);
        }

        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}